

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContextTest.cpp
# Opt level: O2

void __thiscall
ContextTest_shouldSetControlRequestChannel_Test::TestBody
          (ContextTest_shouldSetControlRequestChannel_Test *this)

{
  bool bVar1;
  string *psVar2;
  char *in_R9;
  AssertHelper local_2c0;
  string local_2b8;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ChannelUri uri;
  Context ctx;
  Configuration cfg;
  
  aeron::archive::Configuration::Configuration(&cfg);
  aeron::archive::Context::Context(&ctx,&cfg);
  psVar2 = aeron::archive::Context::controlRequestChannel_abi_cxx11_(&ctx);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = psVar2->_M_string_length != 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_2b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&uri.prefix_,(internal *)&gtest_ar_,
               (AssertionResult *)"ctx.controlRequestChannel().empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/test/ContextTest.cpp"
               ,0x1c,uri.prefix_._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    std::__cxx11::string::~string((string *)&uri);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  psVar2 = aeron::archive::Context::controlRequestChannel_abi_cxx11_(&ctx);
  aeron::archive::ChannelUri::parse(&uri,psVar2);
  std::__cxx11::string::string((string *)&local_2b8,"term-length",(allocator *)&local_2c0);
  aeron::archive::ChannelUri::get
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&gtest_ar_,&uri,&local_2b8);
  gtest_ar__1.success_ = gtest_ar_.success_;
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base((optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&local_2b8);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&local_2b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"uri.get(\"term-length\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/test/ContextTest.cpp"
               ,0x1f,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  std::__cxx11::string::string((string *)&local_2b8,"mtu",(allocator *)&local_2c0);
  aeron::archive::ChannelUri::get
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&gtest_ar_,&uri,&local_2b8);
  gtest_ar__1.success_ = gtest_ar_.success_;
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base((optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&local_2b8);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&local_2b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"uri.get(\"mtu\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/test/ContextTest.cpp"
               ,0x20,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  std::__cxx11::string::string((string *)&local_2b8,"sparse",(allocator *)&local_2c0);
  aeron::archive::ChannelUri::get
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&gtest_ar_,&uri,&local_2b8);
  bVar1 = gtest_ar_.success_;
  gtest_ar__1.success_ = gtest_ar_.success_;
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base((optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&local_2b8);
  if (bVar1 == false) {
    testing::Message::Message((Message *)&local_2b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"uri.get(\"sparse\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/test/ContextTest.cpp"
               ,0x21,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_2b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  aeron::archive::ChannelUri::~ChannelUri(&uri);
  aeron::archive::Context::~Context(&ctx);
  aeron::archive::Configuration::~Configuration(&cfg);
  return;
}

Assistant:

TEST(ContextTest, shouldSetControlRequestChannel) {
    Configuration cfg;
    Context ctx(cfg);

    EXPECT_FALSE(ctx.controlRequestChannel().empty());

    ChannelUri uri = ChannelUri::parse(ctx.controlRequestChannel());
    EXPECT_TRUE(uri.get("term-length"));
    EXPECT_TRUE(uri.get("mtu"));
    EXPECT_TRUE(uri.get("sparse"));
}